

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::dfsForRandomIterative(Graph *this)

{
  ulong uVar1;
  _Map_pointer ppNVar2;
  ulong *puVar3;
  pointer pvVar4;
  uint64_t uVar5;
  pointer pEVar6;
  pointer puVar7;
  _Map_pointer ppNVar8;
  Graph *pGVar9;
  uint64_t *puVar10;
  _Map_pointer ppNVar11;
  result_type_conflict rVar12;
  void *pvVar13;
  Node *pNVar14;
  uint64_t *puVar15;
  _Elt_pointer pNVar16;
  size_t sVar17;
  uint64_t *puVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long *plVar22;
  uint64_t uVar23;
  _Map_pointer ppNVar24;
  uint64_t uVar25;
  stack<Node,_std::deque<Node,_std::allocator<Node>_>_> stack;
  uint64_t *local_150;
  long *local_148;
  void *local_140;
  long *local_138;
  uint64_t *local_130;
  ulong local_128;
  uint64_t *local_120;
  void *local_118;
  ulong uStack_110;
  uint64_t *local_f8;
  long *plStack_f0;
  uint64_t *local_e8;
  uint64_t *puStack_e0;
  uint64_t *local_d8;
  long *plStack_d0;
  uint64_t *local_c8;
  stack<Node,_std::deque<Node,_std::allocator<Node>_>_> local_a8;
  value_type local_58;
  ulong local_40;
  Graph *local_38;
  
  uStack_110 = 8;
  local_118 = operator_new(0x40);
  puVar10 = (uint64_t *)operator_new(0x200);
  plStack_f0 = (long *)((long)local_118 + 0x18);
  *(uint64_t **)((long)local_118 + 0x18) = puVar10;
  local_f8 = puVar10 + 0x40;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = (_Elt_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = (_Map_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = (_Elt_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = (_Elt_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 8;
  ppNVar11 = (_Map_pointer)operator_new(0x40);
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_map =
       ppNVar11;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)operator_new(0x200);
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = ppNVar11 + 3;
  ppNVar11[3] = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur + 0x20;
  local_58.vertex = 0;
  local_58.start = 0;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push(&local_a8,&local_58);
  *(this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
   super__Vector_impl_data._M_start = Grey;
  local_e8 = puVar10;
  puStack_e0 = puVar10;
  local_d8 = local_f8;
  plStack_d0 = plStack_f0;
  pGVar9 = this;
  local_130 = puVar10;
  local_148 = plStack_f0;
  ppNVar11 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_map;
  ppNVar8 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_node;
  if (local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    do {
      local_38 = pGVar9;
      pNVar16 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      pNVar14 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first) {
        pNVar14 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        pNVar16 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      uVar23 = pNVar14[-1].vertex;
      uVar20 = pNVar16[-1].start;
      if (local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first) {
        operator_delete(local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first,0x200);
        local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first =
             local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1];
        local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_last =
             local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + 0x20;
        local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur =
             local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node =
             local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur =
             local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur + -1;
      }
      local_130 = local_e8;
      local_150 = local_d8;
      local_148 = plStack_d0;
      local_138 = plStack_f0;
      local_120 = puStack_e0;
      local_c8 = local_f8;
      local_140 = local_118;
      local_128 = uStack_110;
      while (pvVar4 = (this->matrix).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            lVar21 = *(long *)&pvVar4[uVar23].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl,
            uVar20 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar4[uVar23].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl + 8) - lVar21 >> 3)) {
        uVar5 = *(uint64_t *)(lVar21 + uVar20 * 8);
        pEVar6 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar25 = pEVar6[uVar5].super_LightEdge.u;
        if (uVar25 == uVar23) {
          uVar25 = pEVar6[uVar5].super_LightEdge.v;
        }
        if (pEVar6[uVar5].finished == true) {
LAB_00103681:
          uVar20 = uVar20 + 1;
        }
        else {
          pEVar6[uVar5].finished = true;
          if ((this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar25] != White) {
            rVar12 = std::uniform_int_distribution<unsigned_long>::operator()
                               (&rand,&engine,&rand._M_param);
            pEVar6[uVar5].shift = rVar12;
            puVar7 = (this->sums).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar3 = puVar7 + uVar25;
            *puVar3 = *puVar3 ^ rVar12;
            puVar3 = puVar7 + uVar23;
            *puVar3 = *puVar3 ^ pEVar6[uVar5].shift;
            goto LAB_00103681;
          }
          if (local_130 == local_150 + -2) {
            lVar21 = (long)local_148 - (long)local_138 >> 3;
            if (((long)local_c8 - (long)puVar10 >> 4) + ((long)local_130 - (long)local_120 >> 4) +
                (lVar21 + -1 + (ulong)(local_148 == (long *)0x0)) * 0x20 == 0x7ffffffffffffff) {
              std::__throw_length_error("cannot create std::deque larger than max_size()");
            }
            if (local_128 - ((long)local_148 - (long)local_140 >> 3) < 2) {
              if (lVar21 * 2 + 4U < local_128) {
                plVar22 = (long *)((long)local_140 +
                                  (local_128 - (lVar21 + 2) & 0xfffffffffffffffe) * 4);
                if (plVar22 < local_138) {
                  sVar17 = (long)local_148 + (8 - (long)local_138);
                  if (sVar17 != 0) {
                    memmove(plVar22,local_138,sVar17);
                  }
                }
                else {
                  sVar17 = (long)local_148 + (8 - (long)local_138);
                  if (sVar17 != 0) {
                    memmove((void *)((long)plVar22 + ((lVar21 + 1) * 8 - sVar17)),local_138,sVar17);
                  }
                }
              }
              else {
                lVar19 = local_128 * 2 + (ulong)(local_128 == 0);
                uVar1 = lVar19 + 2;
                if (uVar1 >> 0x3c != 0) {
                  if (uVar1 >> 0x3d != 0) {
                    std::__throw_bad_array_new_length();
                  }
                  std::__throw_bad_alloc();
                }
                local_40 = uVar1;
                pvVar13 = operator_new(uVar1 * 8);
                plVar22 = (long *)((long)pvVar13 + (lVar19 - lVar21 & 0xfffffffffffffffeU) * 4);
                sVar17 = (long)local_148 + (8 - (long)local_138);
                if (sVar17 != 0) {
                  memmove(plVar22,local_138,sVar17);
                }
                operator_delete(local_140,local_128 << 3);
                local_128 = local_40;
                local_140 = pvVar13;
              }
              local_c8 = (uint64_t *)(*plVar22 + 0x200);
              local_148 = plVar22 + lVar21;
              local_138 = plVar22;
            }
            local_120 = (uint64_t *)operator_new(0x200);
            local_148[1] = (long)local_120;
            local_148 = local_148 + 1;
            *local_130 = uVar25;
            local_130[1] = uVar5;
            local_150 = local_120 + 0x40;
            this = local_38;
            local_130 = local_120;
          }
          else {
            *local_130 = uVar25;
            local_130[1] = uVar5;
            local_130 = local_130 + 2;
          }
          local_58.start = uVar20 + 1;
          local_58.vertex = uVar23;
          std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push(&local_a8,&local_58);
          (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl
          .super__Vector_impl_data._M_start[uVar25] = Grey;
          uVar20 = 0;
          uVar23 = uVar25;
        }
      }
      local_e8 = local_130;
      local_d8 = local_150;
      plStack_d0 = local_148;
      plStack_f0 = local_138;
      puStack_e0 = local_120;
      local_f8 = local_c8;
      uStack_110 = local_128;
      local_118 = local_140;
      (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23] = Black;
      pGVar9 = local_38;
      puStack_e0 = local_120;
      ppNVar11 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_map;
      ppNVar8 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
    } while (local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  while (local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
         _M_map = ppNVar11,
        local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node = ppNVar8, local_130 != puVar10) {
    puVar18 = local_130;
    puVar15 = local_130;
    if (local_130 == puStack_e0) {
      puVar15 = (uint64_t *)(local_148[-1] + 0x200);
      puVar18 = (uint64_t *)(local_148[-1] + 0x200);
    }
    uVar23 = puVar15[-2];
    uVar5 = puVar18[-1];
    if (local_130 == puStack_e0) {
      operator_delete(puStack_e0,0x200);
      plStack_d0 = local_148 + -1;
      puStack_e0 = (uint64_t *)local_148[-1];
      local_130 = puStack_e0 + 0x3e;
    }
    else {
      local_130 = local_130 + -2;
      plStack_d0 = local_148;
    }
    pEVar6 = *(pointer *)
              &((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)((long)this + 0x18))->
               super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>;
    puVar7 = *(pointer *)
              &((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this + 0x48))->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    uVar20 = puVar7[uVar23];
    pEVar6[uVar5].shift = uVar20;
    puVar7[pEVar6[uVar5].super_LightEdge.v] = puVar7[pEVar6[uVar5].super_LightEdge.v] ^ uVar20;
    puVar7[pEVar6[uVar5].super_LightEdge.u] =
         puVar7[pEVar6[uVar5].super_LightEdge.u] ^ pEVar6[uVar5].shift;
    local_148 = plStack_d0;
    ppNVar11 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
               super__Deque_impl_data._M_map;
    ppNVar8 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
  }
  if (ppNVar11 != (_Map_pointer)0x0) {
    if (local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node < ppNVar8 + 1) {
      ppNVar24 = local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node + -1;
      do {
        ppNVar2 = ppNVar24 + 1;
        ppNVar24 = ppNVar24 + 1;
        operator_delete(*ppNVar2,0x200);
      } while (ppNVar24 < ppNVar8);
    }
    operator_delete(ppNVar11,local_a8.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Deque_impl_data._M_map_size << 3);
  }
  if (local_118 != (void *)0x0) {
    if (plStack_f0 < local_148 + 1) {
      plStack_f0 = (long *)((long)plStack_f0 + 0xfffffffffffffff8);
      do {
        plVar22 = plStack_f0 + 1;
        plStack_f0 = plStack_f0 + 1;
        operator_delete((void *)*plVar22,0x200);
      } while (plStack_f0 < local_148);
    }
    operator_delete(local_118,uStack_110 << 3);
    return;
  }
  return;
}

Assistant:

void Graph::dfsForRandomIterative() {
    struct Node {
        std::uint64_t vertex;
        std::uint64_t start;
    };

    struct Tree {
        std::uint64_t vertex;
        std::uint64_t edge;
    };

    std::stack<Tree> ostov;
    std::stack<Node> stack;
    stack.push({0, 0});

    colorMap[0] = Colors::Grey;
    while (!stack.empty()) {
        std::uint64_t u = stack.top().vertex;
        std::uint64_t i = stack.top().start;
        stack.pop();

        while (i < matrix[u].size()) {
            auto &e = edges[matrix[u][i]];
            std::uint64_t v = ((e.u != u) ? e.u : e.v);

            if (e.finished) {
                ++i;
                continue;
            }

            e.finished = true;
            if (colorMap[v] == Colors::White) {
                ostov.push({v, matrix[u][i]});
                stack.push({u, i + 1});

                u = v;
                colorMap[u] = Colors::Grey;
                i = 0;
            } else {
                e.shift = rand(engine);
                sums[v] ^= e.shift;
                sums[u] ^= e.shift;
                ++i;
            }
        }

        colorMap[u] = Colors::Black;
    }

    while (!ostov.empty()) {
        std::uint64_t u = ostov.top().vertex;
        std::uint64_t i = ostov.top().edge;
        ostov.pop();

        auto &e = edges[i];
        e.shift = sums[u];
        sums[e.v] ^= e.shift;
        sums[e.u] ^= e.shift;
    }
}